

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O2

void * mraa_iio_event_handler(void *arg)

{
  int __fd;
  pollfd local_48;
  iio_event_data data;
  
  while (__fd = *(int *)((long)arg + 0x14), -1 < __fd) {
    local_48.events = 1;
    local_48.fd = __fd;
    poll(&local_48,1,-1);
    read(__fd,&data,0x10);
    pthread_setcancelstate(1,(int *)0x0);
    (**(code **)((long)arg + 0x28))();
    pthread_setcancelstate(0,(int *)0x0);
  }
  pthread_setcancelstate(1,(int *)0x0);
  return (void *)0x0;
}

Assistant:

static void*
mraa_iio_event_handler(void* arg)
{
    struct iio_event_data data;
    mraa_iio_context dev = (mraa_iio_context) arg;

    for (;;) {
        if (mraa_iio_event_poll_nonblock(dev->fp_event, &data) == MRAA_SUCCESS) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            dev->isr_event(&data, dev->isr_args);
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            return NULL;
        }
    }
}